

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

uintptr_t lj_trace_unwind(jit_State *J,uintptr_t addr,ExitNo *ep)

{
  ulong uVar1;
  MCode *pMVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3._0_2_ = J[-1].bpropcache[6].key;
  uVar3._2_2_ = J[-1].bpropcache[6].val;
  uVar4 = (ulong)J->trace[uVar3].gcptr32;
  if ((uVar4 != 0) && (uVar1 = *(ulong *)(uVar4 + 0x40), uVar1 <= addr)) {
    pMVar2 = (MCode *)0x0;
    if (addr < *(uint *)(uVar4 + 0x3c) + uVar1) {
      uVar3 = (uint)*(ushort *)(uVar4 + 6);
      do {
        uVar5 = (int)pMVar2 + uVar3 >> 1;
        if ((ulong)*(ushort *)(*(long *)(uVar4 + 0x20) + 6 + (ulong)uVar5 * 0xc) <= addr - uVar1) {
          pMVar2 = (MCode *)(ulong)(uVar5 + 1);
          uVar5 = uVar3;
        }
        uVar3 = uVar5;
      } while ((uint)pMVar2 < uVar3);
      *ep = uVar3 - 1;
      pMVar2 = J->exitstubgroup[uVar3 - 1 >> 5] + (uVar3 * 4 - 4 & 0x7c);
    }
    return (uintptr_t)pMVar2;
  }
  return 0;
}

Assistant:

uintptr_t LJ_FASTCALL lj_trace_unwind(jit_State *J, uintptr_t addr, ExitNo *ep)
{
#if EXITTRACE_VMSTATE
  TraceNo traceno = J2G(J)->vmstate;
#else
  TraceNo traceno = trace_exit_find(J, (MCode *)addr);
#endif
  GCtrace *T = traceref(J, traceno);
  if (T
#if EXITTRACE_VMSTATE
      && addr >= (uintptr_t)T->mcode && addr < (uintptr_t)T->mcode + T->szmcode
#endif
     ) {
    SnapShot *snap = T->snap;
    SnapNo lo = 0, exitno = T->nsnap;
    uintptr_t ofs = (uintptr_t)((MCode *)addr - T->mcode);  /* MCode units! */
    /* Rightmost binary search for mcode offset to determine exit number. */
    do {
      SnapNo mid = (lo+exitno) >> 1;
      if (ofs < snap[mid].mcofs) exitno = mid; else lo = mid + 1;
    } while (lo < exitno);
    exitno--;
    *ep = exitno;
#ifdef EXITSTUBS_PER_GROUP
    return (uintptr_t)exitstub_addr(J, exitno);
#else
    return (uintptr_t)exitstub_trace_addr(T, exitno);
#endif
  }
  lj_assertJ(0, "bad exit pc");
  return 0;
}